

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

void xmlSchemaFreeType(xmlSchemaTypePtr type)

{
  _xmlSchemaFacet *p_Var1;
  _xmlSchemaTypeLink *p_Var2;
  _xmlSchemaFacetLink *p_Var3;
  xmlSchemaFacetLinkPtr pxVar4;
  xmlSchemaFacetPtr facet;
  xmlSchemaTypeLinkPtr pxVar5;
  
  if (type != (xmlSchemaTypePtr)0x0) {
    if (type->annot != (xmlSchemaAnnotPtr)0x0) {
      xmlSchemaFreeAnnot(type->annot);
    }
    facet = type->facets;
    if (type->facets != (xmlSchemaFacetPtr)0x0) {
      while (facet != (xmlSchemaFacetPtr)0x0) {
        p_Var1 = facet->next;
        xmlSchemaFreeFacet(facet);
        facet = p_Var1;
      }
    }
    if ((xmlSchemaItemListPtr)type->attrUses != (xmlSchemaItemListPtr)0x0) {
      xmlSchemaItemListFree((xmlSchemaItemListPtr)type->attrUses);
    }
    pxVar5 = type->memberTypes;
    if (pxVar5 != (xmlSchemaTypeLinkPtr)0x0) {
      while (pxVar5 != (xmlSchemaTypeLinkPtr)0x0) {
        p_Var2 = pxVar5->next;
        (*xmlFree)(pxVar5);
        pxVar5 = p_Var2;
      }
    }
    pxVar4 = type->facetSet;
    while (pxVar4 != (xmlSchemaFacetLinkPtr)0x0) {
      p_Var3 = pxVar4->next;
      (*xmlFree)(pxVar4);
      pxVar4 = p_Var3;
    }
    if (type->contModel != (xmlRegexpPtr)0x0) {
      xmlRegFreeRegexp(type->contModel);
    }
    (*xmlFree)(type);
    return;
  }
  return;
}

Assistant:

void
xmlSchemaFreeType(xmlSchemaTypePtr type)
{
    if (type == NULL)
        return;
    if (type->annot != NULL)
        xmlSchemaFreeAnnot(type->annot);
    if (type->facets != NULL) {
        xmlSchemaFacetPtr facet, next;

        facet = type->facets;
        while (facet != NULL) {
            next = facet->next;
            xmlSchemaFreeFacet(facet);
            facet = next;
        }
    }
    if (type->attrUses != NULL)
	xmlSchemaItemListFree((xmlSchemaItemListPtr) type->attrUses);
    if (type->memberTypes != NULL)
	xmlSchemaFreeTypeLinkList(type->memberTypes);
    if (type->facetSet != NULL) {
	xmlSchemaFacetLinkPtr next, link;

	link = type->facetSet;
	do {
	    next = link->next;
	    xmlFree(link);
	    link = next;
	} while (link != NULL);
    }
    if (type->contModel != NULL)
        xmlRegFreeRegexp(type->contModel);
    xmlFree(type);
}